

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

TokenList * scanTokens(void)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  TokenList *pTVar4;
  TokenList *pTVar5;
  TokenList *pTVar6;
  byte bVar7;
  TokenList *pTVar8;
  uint uVar9;
  TokenType TVar10;
  Keyword *pKVar11;
  char *__s2;
  uint uVar12;
  ulong __n;
  byte *pbVar13;
  byte *pbVar14;
  
  bVar7 = *scanner_2;
  uVar9 = scanner_3;
  if (bVar7 == 0) {
    pTVar8 = (TokenList *)0x0;
    pTVar4 = (TokenList *)0x0;
    pbVar14 = scanner_2;
    pbVar13 = scanner_2;
    scanner_1 = scanner_2;
LAB_001028f2:
    pTVar6 = (TokenList *)malloc(0x28);
    (pTVar6->value).type = TOKEN_EOF;
    (pTVar6->value).start = (char *)pbVar13;
    (pTVar6->value).length = (int)pbVar14 - (int)pbVar13;
    (pTVar6->value).line = uVar9;
    pTVar6->next = (TokenList *)0x0;
    if (pTVar8 != (TokenList *)0x0) {
      pTVar4->next = pTVar6;
      pTVar6 = pTVar8;
    }
    return pTVar6;
  }
  pTVar8 = (TokenList *)0x0;
  pTVar4 = (TokenList *)0x0;
  pbVar13 = scanner_2;
LAB_00102405:
  pbVar14 = pbVar13 + 1;
  scanner_1 = pbVar13;
  if ((bVar7 != 0x5f) && ((byte)((bVar7 & 0xdf) + 0xa5) < 0xe6)) {
    scanner_2 = pbVar14;
    if (0xf5 < (byte)(bVar7 - 0x3a)) {
      bVar7 = pbVar13[1];
      while (0xf5 < (byte)(bVar7 - 0x3a)) {
        pbVar14 = scanner_2 + 1;
        scanner_2 = scanner_2 + 1;
        bVar7 = *pbVar14;
      }
      if (bVar7 == 0x2e) {
        bVar7 = scanner_2[1];
        while (0xf5 < (byte)(bVar7 - 0x3a)) {
          pbVar14 = scanner_2 + 1;
          scanner_2 = scanner_2 + 1;
          bVar7 = *pbVar14;
        }
      }
      __n = (ulong)(uint)((int)scanner_2 - (int)pbVar13);
      TVar10 = TOKEN_NUMBER;
      pbVar14 = scanner_2;
      goto LAB_00102885;
    }
    if (bVar7 < 0x20) {
      if (bVar7 == 0xd) {
        bVar7 = *pbVar14;
        if (bVar7 == 10) {
          uVar9 = uVar9 + 1;
          TVar10 = TOKEN_NEWLINE;
          scanner_3 = uVar9;
          goto LAB_00102825;
        }
        goto joined_r0x001024b1;
      }
      if (bVar7 == 9) {
        TVar10 = TOKEN_INDENT;
      }
      else {
        if (bVar7 != 10) goto switchD_0010245b_caseD_23;
        uVar9 = uVar9 + 1;
        TVar10 = TOKEN_NEWLINE;
        scanner_3 = uVar9;
      }
      goto LAB_0010287f;
    }
    if (0x5a < bVar7) {
      if (bVar7 < 0x5e) {
        if (bVar7 == 0x5b) {
          TVar10 = TOKEN_LEFT_SQUARE;
        }
        else {
          if (bVar7 != 0x5d) goto switchD_0010245b_caseD_23;
          TVar10 = TOKEN_RIGHT_SQUARE;
        }
      }
      else if (bVar7 == 0x5e) {
        TVar10 = TOKEN_CARET;
      }
      else if (bVar7 == 0x7b) {
        TVar10 = TOKEN_LEFT_BRACE;
      }
      else {
        if (bVar7 != 0x7d) goto switchD_0010245b_caseD_23;
        TVar10 = TOKEN_RIGHT_BRACE;
      }
      goto LAB_0010287f;
    }
    switch(bVar7) {
    case 0x20:
      bVar7 = *pbVar14;
      if (bVar7 == 0x20) {
        __n = 1;
        do {
          uVar2 = (uint)__n;
          uVar12 = uVar2 + 1;
          __n = (ulong)uVar12;
          pbVar1 = pbVar14 + 1;
          pbVar14 = pbVar14 + 1;
          if (*pbVar1 != 0x20) break;
        } while (uVar2 < 3);
        scanner_2 = pbVar14;
        if (uVar12 == 4) {
          TVar10 = TOKEN_INDENT;
          goto LAB_00102885;
        }
        bVar7 = *pbVar14;
      }
      goto joined_r0x001024b1;
    case 0x21:
      if (pbVar13[1] == 0x3d) {
        TVar10 = TOKEN_BANG_EQUAL;
LAB_00102825:
        __n = 2;
        pbVar14 = pbVar13 + 2;
        scanner_2 = pbVar13 + 2;
        goto LAB_00102885;
      }
      TVar10 = TOKEN_BANG;
      break;
    case 0x22:
      do {
        bVar7 = *pbVar14;
        if (bVar7 < 0x22) {
          if (bVar7 == 10) {
            uVar9 = uVar9 + 1;
            scanner_3 = uVar9;
          }
          else if (bVar7 == 0) goto LAB_0010284f;
        }
        else if (bVar7 == 0x5c) {
          if (pbVar14[1] == 0x22) {
            pbVar14 = pbVar14 + 1;
          }
        }
        else if (bVar7 == 0x22) {
          pbVar14 = pbVar14 + 1;
          __n = (ulong)(uint)((int)pbVar14 - (int)pbVar13);
          TVar10 = TOKEN_STRING;
          scanner_2 = pbVar14;
          goto LAB_00102885;
        }
        pbVar14 = pbVar14 + 1;
      } while( true );
    default:
switchD_0010245b_caseD_23:
      printf("\x1b[31m\n[Error] [Line:%d] Unexpected character %c!\x1b[0m",(ulong)uVar9,
             (ulong)(uint)(int)(char)bVar7);
      se = se + 1;
      pbVar14 = scanner_2;
      pbVar13 = scanner_1;
      uVar9 = scanner_3;
      goto LAB_001028f2;
    case 0x25:
      TVar10 = TOKEN_PERCEN;
      break;
    case 0x28:
      TVar10 = TOKEN_LEFT_PAREN;
      break;
    case 0x29:
      __n = 1;
      TVar10 = TOKEN_RIGHT_PAREN;
      goto LAB_00102885;
    case 0x2a:
      TVar10 = TOKEN_STAR;
      break;
    case 0x2b:
      TVar10 = TOKEN_PLUS;
      break;
    case 0x2c:
      TVar10 = TOKEN_COMMA;
      break;
    case 0x2d:
      TVar10 = TOKEN_MINUS;
      break;
    case 0x2e:
      TVar10 = TOKEN_DOT;
      break;
    case 0x2f:
      TVar10 = TOKEN_SLASH;
      break;
    case 0x3a:
      TVar10 = TOKEN_COLON;
      break;
    case 0x3b:
      TVar10 = TOKEN_SEMICOLON;
      break;
    case 0x3c:
      if (pbVar13[1] == 0x3d) {
        TVar10 = TOKEN_LESS_EQUAL;
        goto LAB_00102825;
      }
      TVar10 = TOKEN_LESS;
      break;
    case 0x3d:
      if (pbVar13[1] == 0x3d) {
        TVar10 = TOKEN_EQUAL_EQUAL;
        goto LAB_00102825;
      }
      TVar10 = TOKEN_EQUAL;
      break;
    case 0x3e:
      if (pbVar13[1] == 0x3d) {
        TVar10 = TOKEN_GREATER_EQUAL;
        goto LAB_00102825;
      }
      TVar10 = TOKEN_GREATER;
    }
LAB_0010287f:
    __n = 1;
    goto LAB_00102885;
  }
  bVar7 = pbVar13[1];
  while (((bVar7 == 0x5f || (0xf5 < (byte)(bVar7 - 0x3a))) || (0xe5 < (byte)((bVar7 & 0xdf) + 0xa5))
         )) {
    pbVar1 = (byte *)((long)pbVar14 + 1);
    pbVar14 = (byte *)((long)pbVar14 + 1);
    bVar7 = *pbVar1;
  }
  __n = (long)pbVar14 - (long)pbVar13;
  pKVar11 = keywords;
  __s2 = "Begin";
  scanner_2 = pbVar14;
  do {
    pKVar11 = pKVar11 + 1;
    if ((__n == pKVar11[-1].length) && (iVar3 = bcmp(pbVar13,__s2,__n), iVar3 == 0)) {
      TVar10 = pKVar11[-1].type;
      if (TVar10 != TOKEN_EOF) goto LAB_00102885;
      goto LAB_001028f2;
    }
    __s2 = pKVar11->name;
  } while (__s2 != (char *)0x0);
  TVar10 = TOKEN_IDENTIFIER;
LAB_00102885:
  pTVar5 = (TokenList *)malloc(0x28);
  (pTVar5->value).type = TVar10;
  (pTVar5->value).start = (char *)pbVar13;
  (pTVar5->value).length = (int)__n;
  (pTVar5->value).line = uVar9;
  pTVar5->next = (TokenList *)0x0;
  pTVar6 = pTVar5;
  if (pTVar8 != (TokenList *)0x0) {
    pTVar4->next = pTVar5;
    pTVar6 = pTVar8;
  }
  bVar7 = *pbVar14;
  pTVar8 = pTVar6;
  pTVar4 = pTVar5;
joined_r0x001024b1:
  pbVar13 = pbVar14;
  scanner_1 = pbVar14;
  if (bVar7 == 0) goto LAB_001028f2;
  goto LAB_00102405;
LAB_0010284f:
  TVar10 = TOKEN_ERROR;
  __n = 0x14;
  pbVar13 = (byte *)"Unterminated string.";
  scanner_2 = pbVar14;
  goto LAB_00102885;
}

Assistant:

TokenList* scanTokens(){
    TokenList *ret = NULL, *head = NULL;
    Token t;
    while((t = scanToken()).type != TOKEN_EOF){
        //info("Looping in makelist");
        insertList(&head, &ret, newList(t));
    }

    insertList(&head, &ret, newList(makeToken(TOKEN_EOF)));

    return head;
}